

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,gnuplotio::ModeBinary>
               (char *stream,long *arg)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  value_type local_30;
  
  lVar1 = *arg;
  if (arg[1] != lVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_30 = IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>
                 ::deref((IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>
                          *)(lVar1 + lVar2));
      std::ostream::write(stream,(long)&local_30);
      uVar3 = uVar3 + 1;
      lVar1 = *arg;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)(arg[1] - lVar1 >> 4));
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}